

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.cc
# Opt level: O2

int __thiscall
tchecker::parsing::program::parser_t::context::expected_tokens
          (context *this,symbol_kind_type *yyarg,int yyargn)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = (int)*(short *)(yypact_ +
                         (long)(this->yyparser_->yystack_).seq_.
                               super__Vector_base<tchecker::parsing::program::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::program::parser_t::stack_symbol_type>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].
                               super_basic_symbol<tchecker::parsing::program::parser_t::by_state>.
                               super_by_state.state * 2);
  iVar1 = 0;
  if (iVar5 != -0x20) {
    iVar3 = -iVar5;
    iVar4 = 0x21;
    if (0xb3 - iVar5 < 0x21) {
      iVar4 = 0xb3 - iVar5;
    }
    uVar2 = 0;
    uVar6 = (long)iVar5;
    if ((long)iVar5 < 1) {
      uVar6 = uVar2;
    }
    for (; iVar1 = (int)uVar2, (long)((long)iVar3 + uVar6) < (long)iVar4; uVar6 = uVar6 + 1) {
      if ((((long)iVar3 + uVar6 != 1) && (iVar3 + (int)uVar6 == (int)(char)(&yycheck_)[uVar6])) &&
         ((&yytable_)[uVar6] != -1)) {
        if (yyarg == (symbol_kind_type *)0x0) {
          uVar2 = (ulong)(iVar1 + 1);
        }
        else {
          if (iVar1 == yyargn) goto LAB_0018b909;
          uVar2 = (ulong)(iVar1 + 1);
          yyarg[iVar1] = (int)(char)(&yycheck_)[uVar6];
        }
      }
    }
  }
  if (((0 < yyargn) && (yyarg != (symbol_kind_type *)0x0)) && (iVar1 == 0)) {
    *yyarg = S_YYEMPTY;
LAB_0018b909:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
  parser_t::context::expected_tokens (symbol_kind_type yyarg[], int yyargn) const
  {
    // Actual number of expected tokens
    int yycount = 0;

    const int yyn = yypact_[+yyparser_.yystack_[0].state];
    if (!yy_pact_value_is_default_ (yyn))
      {
        /* Start YYX at -YYN if negative to avoid negative indexes in
           YYCHECK.  In other words, skip the first -YYN actions for
           this state because they are default actions.  */
        const int yyxbegin = yyn < 0 ? -yyn : 0;
        // Stay within bounds of both yycheck and yytname.
        const int yychecklim = yylast_ - yyn + 1;
        const int yyxend = yychecklim < YYNTOKENS ? yychecklim : YYNTOKENS;
        for (int yyx = yyxbegin; yyx < yyxend; ++yyx)
          if (yycheck_[yyx + yyn] == yyx && yyx != symbol_kind::S_YYerror
              && !yy_table_value_is_error_ (yytable_[yyx + yyn]))
            {
              if (!yyarg)
                ++yycount;
              else if (yycount == yyargn)
                return 0;
              else
                yyarg[yycount++] = YY_CAST (symbol_kind_type, yyx);
            }
      }

    if (yyarg && yycount == 0 && 0 < yyargn)
      yyarg[0] = symbol_kind::S_YYEMPTY;
    return yycount;
  }